

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode setopt_cptr(Curl_easy *data,CURLoption option,char *ptr)

{
  undefined1 *puVar1;
  size_t length;
  char *string;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  char *pcVar6;
  hsts *phVar7;
  curl_slist *pcVar8;
  altsvcinfo *paVar9;
  ulong uVar10;
  CookieInfo *pCVar11;
  size_t sVar12;
  ulong uVar13;
  curl_prot_t *val;
  char **charp;
  char *p;
  char *u;
  
  CVar5 = CURLE_OK;
  CVar4 = CURLE_UNKNOWN_OPTION;
  if ((int)option < 0x27a5) {
    if (0x274d < (int)option) {
      if (0x277c < (int)option) {
        if ((int)option < 0x2796) {
          if (option == CURLOPT_SSL_CTX_DATA) {
            _Var2 = Curl_ssl_supports(data,8);
            if (!_Var2) {
              return CURLE_NOT_BUILT_IN;
            }
            (data->set).ssl.fsslctxp = ptr;
          }
          else {
            if (option == CURLOPT_NETRC_FILE) {
              charp = (data->set).str + 0x25;
              goto LAB_00154a4a;
            }
            if (option != CURLOPT_IOCTLDATA) {
              return CURLE_UNKNOWN_OPTION;
            }
            (data->set).ioctl_client = ptr;
          }
        }
        else {
          if (option == CURLOPT_FTP_ACCOUNT) {
            charp = (data->set).str + 0x22;
            goto LAB_00154a4a;
          }
          if (option != CURLOPT_COOKIELIST) {
            if (option != CURLOPT_FTP_ALTERNATIVE_TO_USER) {
              return CURLE_UNKNOWN_OPTION;
            }
            charp = (data->set).str + 0x23;
            goto LAB_00154a4a;
          }
          if (ptr == (char *)0x0) goto switchD_00153fb5_caseD_275c;
          iVar3 = curl_strequal(ptr,"ALL");
          if (iVar3 == 0) {
            iVar3 = curl_strequal(ptr,"SESS");
            if (iVar3 == 0) {
              iVar3 = curl_strequal(ptr,"FLUSH");
              if (iVar3 == 0) {
                iVar3 = curl_strequal(ptr,"RELOAD");
                if (iVar3 == 0) {
                  if (data->cookies == (CookieInfo *)0x0) {
                    pCVar11 = Curl_cookie_init(data,(char *)0x0,(CookieInfo *)0x0,true);
                    data->cookies = pCVar11;
                    if (pCVar11 == (CookieInfo *)0x0) {
                      return CURLE_OUT_OF_MEMORY;
                    }
                  }
                  sVar12 = strlen(ptr);
                  if (8000000 < sVar12) {
                    return CURLE_BAD_FUNCTION_ARGUMENT;
                  }
                  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
                  iVar3 = curl_strnequal(ptr,"Set-Cookie:",0xb);
                  if (iVar3 != 0) {
                    ptr = ptr + 0xb;
                  }
                  Curl_cookie_add(data,data->cookies,iVar3 != 0,false,ptr,(char *)0x0,(char *)0x0,
                                  true);
                  goto LAB_00154c0e;
                }
                Curl_cookie_loadfiles(data);
              }
              else {
                CVar5 = CURLE_OK;
                Curl_flush_cookies(data,false);
              }
              goto switchD_00153fb5_caseD_275c;
            }
            Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
            Curl_cookie_clearsess(data->cookies);
          }
          else {
            Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
            Curl_cookie_clearall(data->cookies);
          }
LAB_00154c0e:
          Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
        }
        goto switchD_00153fb5_caseD_275c;
      }
      switch(option) {
      case CURLOPT_RANDOM_FILE:
      case CURLOPT_EGDSOCKET:
        goto switchD_00153fb5_caseD_275c;
      case 0x275e:
      case CURLOPT_RANDOM_FILE|CURLOPT_PORT:
      case 0x2760:
      case 0x2761:
      case 0x2764:
      case 0x2765:
      case 0x276a:
      case CURLOPT_SSLKEYTYPE|CURLOPT_PORT:
      case 0x276c:
      case CURLOPT_PREQUOTE:
      case 0x276e:
      case 0x2770:
      case 0x2772:
      case 0x2773:
      case CURLOPT_SHARE:
      case 0x2775:
        goto switchD_00153f5d_caseD_27b6;
      case CURLOPT_COOKIEJAR:
        CVar5 = Curl_setstropt((data->set).str + 0x1b,ptr);
        if (CVar5 == CURLE_OK) {
          pCVar11 = Curl_cookie_init(data,(char *)0x0,data->cookies,
                                     (_Bool)((byte)(data->set).field_0x89c >> 7));
          CVar5 = CURLE_OUT_OF_MEMORY;
          if (pCVar11 != (CookieInfo *)0x0) {
            CVar5 = CURLE_OK;
          }
          data->cookies = pCVar11;
        }
        goto switchD_00153fb5_caseD_275c;
      case CURLOPT_SSL_CIPHER_LIST:
        _Var2 = Curl_ssl_supports(data,0x200);
        if (!_Var2) {
          return CURLE_NOT_BUILT_IN;
        }
        charp = (data->set).str + 8;
        break;
      case CURLOPT_SSLCERTTYPE:
        charp = (data->set).str + 1;
        break;
      case CURLOPT_SSLKEY:
        charp = (data->set).str + 2;
        break;
      case CURLOPT_SSLKEYTYPE:
        charp = (data->set).str + 4;
        break;
      case CURLOPT_SSLENGINE:
        if (((ptr != (char *)0x0) && (*ptr != '\0')) &&
           (CVar5 = Curl_setstropt((data->set).str + 0x2c,ptr), CVar5 == CURLE_OK)) {
          CVar5 = Curl_ssl_set_engine(data,ptr);
        }
        goto switchD_00153fb5_caseD_275c;
      case CURLOPT_DEBUGDATA:
        (data->set).debugdata = ptr;
        goto switchD_00153fb5_caseD_275c;
      case CURLOPT_CAPATH:
        _Var2 = Curl_ssl_supports(data,1);
        if (!_Var2) {
          return CURLE_NOT_BUILT_IN;
        }
        charp = (data->set).str + 5;
        break;
      case CURLOPT_ACCEPT_ENCODING:
        if (ptr == (char *)0x0) {
          (*Curl_cfree)((data->set).str[0x21]);
          (data->set).str[0x21] = (char *)0x0;
          return CURLE_OK;
        }
        if (*ptr == '\0') {
          Curl_all_content_encodings((char *)&u,0x100);
          CVar5 = Curl_setstropt((data->set).str + 0x21,(char *)&u);
          return CVar5;
        }
        charp = (data->set).str + 0x21;
        break;
      case CURLOPT_PRIVATE:
        (data->set).private_data = ptr;
        goto switchD_00153fb5_caseD_275c;
      default:
        if (option == CURLOPT_INTERFACE) {
          CVar5 = setstropt_interface(ptr,(data->set).str + 0x1e,(data->set).str + 0x1f,
                                      (data->set).str + 0x20);
          return CVar5;
        }
        if (option == CURLOPT_CAINFO) {
          charp = (data->set).str + 6;
          break;
        }
        goto switchD_00153f5d_caseD_27b6;
      }
      goto LAB_00154a4a;
    }
    switch(option) {
    case CURLOPT_WRITEDATA:
      (data->set).out = ptr;
      break;
    case CURLOPT_URL:
      if (((data->state).field_0x7c0 & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        (data->state).url = (char *)0x0;
        puVar1 = &(data->state).field_0x7c0;
        *puVar1 = *puVar1 & 0xfe;
      }
      CVar5 = Curl_setstropt((data->set).str + 0x2a,ptr);
      (data->state).url = (data->set).str[0x2a];
      break;
    case 0x2713:
    case 0x2718:
    case 0x271b:
    case 0x271c:
    case 0x271d:
    case 0x271e:
    case 0x2723:
    case 0x2724:
    case 0x2725:
    case CURLOPT_HTTPHEADER:
    case CURLOPT_HTTPPOST:
    case 0x272b:
    case CURLOPT_QUOTE:
    case 0x272e:
    case 0x2730:
    case 0x2731:
    case 0x2732:
    case CURLOPT_REFERER|CURLOPT_LOW_SPEED_LIMIT:
      goto switchD_00153f5d_caseD_27b6;
    case CURLOPT_PROXY:
      charp = (data->set).str + 0x26;
      goto LAB_00154a4a;
    case CURLOPT_USERPWD:
      CVar5 = setstropt_userpwd(ptr,(data->set).str + 0x2d,(data->set).str + 0x2e);
      return CVar5;
    case CURLOPT_PROXYUSERPWD:
      u = (char *)0x0;
      p = (char *)0x0;
      CVar5 = setstropt_userpwd(ptr,&u,&p);
      pcVar6 = u;
      if (u != (char *)0x0 && CVar5 == CURLE_OK) {
        (*Curl_cfree)((data->set).str[0x30]);
        (data->set).str[0x30] = (char *)0x0;
        CVar5 = Curl_urldecode(pcVar6,0,(data->set).str + 0x30,(size_t *)0x0,REJECT_ZERO);
      }
      string = p;
      if (p != (char *)0x0 && CVar5 == CURLE_OK) {
        (*Curl_cfree)((data->set).str[0x31]);
        (data->set).str[0x31] = (char *)0x0;
        CVar5 = Curl_urldecode(string,0,(data->set).str + 0x31,(size_t *)0x0,REJECT_ZERO);
      }
      (*Curl_cfree)(pcVar6);
      (*Curl_cfree)(string);
      break;
    case CURLOPT_RANGE:
      charp = (data->set).str + 0x28;
      goto LAB_00154a4a;
    case CURLOPT_READDATA:
      (data->set).in_set = ptr;
      break;
    case CURLOPT_ERRORBUFFER:
      (data->set).errorbuffer = ptr;
      break;
    case CURLOPT_POSTFIELDS:
      (data->set).postfields = ptr;
      (*Curl_cfree)((data->set).str[0x4a]);
      (data->set).str[0x4a] = (char *)0x0;
      CVar5 = CURLE_OK;
      goto LAB_00154c3c;
    case CURLOPT_REFERER:
      if (((data->state).field_0x7c0 & 2) != 0) {
        (*Curl_cfree)((data->state).referer);
        (data->state).referer = (char *)0x0;
        puVar1 = &(data->state).field_0x7c0;
        *puVar1 = *puVar1 & 0xfd;
      }
      CVar5 = Curl_setstropt((data->set).str + 0x29,ptr);
      (data->state).referer = (data->set).str[0x29];
      break;
    case CURLOPT_FTPPORT:
      CVar5 = Curl_setstropt((data->set).str + 0x24,ptr);
      uVar13 = (ulong)((data->set).str[0x24] != (char *)0x0) << 0xf;
      uVar10 = 0xffffffffffff7fff;
      goto LAB_00154981;
    case CURLOPT_USERAGENT:
      charp = (data->set).str + 0x2b;
      goto LAB_00154a4a;
    case CURLOPT_COOKIE:
      charp = (data->set).str + 0x1a;
      goto LAB_00154a4a;
    case CURLOPT_SSLCERT:
      charp = (data->set).str;
      goto LAB_00154a4a;
    case CURLOPT_KEYPASSWD:
      charp = (data->set).str + 3;
      goto LAB_00154a4a;
    case CURLOPT_HEADERDATA:
      (data->set).writeheader = ptr;
      break;
    case CURLOPT_COOKIEFILE:
      if (ptr == (char *)0x0) {
        curl_slist_free_all((data->state).cookielist);
        (data->state).cookielist = (curl_slist *)0x0;
        if ((data->share == (Curl_share *)0x0) || (data->share->cookies == (CookieInfo *)0x0)) {
          Curl_cookie_clearall(data->cookies);
          Curl_cookie_cleanup(data->cookies);
        }
        data->cookies = (CookieInfo *)0x0;
      }
      else {
        sVar12 = strlen(ptr);
        if (8000000 < sVar12) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar8 = curl_slist_append((data->state).cookielist,ptr);
        if (pcVar8 == (curl_slist *)0x0) {
          curl_slist_free_all((data->state).cookielist);
          (data->state).cookielist = (curl_slist *)0x0;
          return CURLE_OUT_OF_MEMORY;
        }
        (data->state).cookielist = pcVar8;
      }
      break;
    case CURLOPT_CUSTOMREQUEST:
      charp = (data->set).str + 0x1c;
      goto LAB_00154a4a;
    default:
      if (option != CURLOPT_XFERINFODATA) {
        return CURLE_UNKNOWN_OPTION;
      }
      (data->set).progress_client = ptr;
    }
    goto switchD_00153fb5_caseD_275c;
  }
  switch(option) {
  case CURLOPT_OPENSOCKETDATA:
    (data->set).opensocket_client = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_COPYPOSTFIELDS:
    if (ptr == (char *)0x0) {
      (*Curl_cfree)((data->set).str[0x4a]);
      (data->set).str[0x4a] = (char *)0x0;
      pcVar6 = (char *)0x0;
LAB_00154b63:
      CVar5 = CURLE_OK;
    }
    else {
      length = (data->set).postfieldsize;
      if (length != 0xffffffffffffffff) {
        if ((long)length < 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar6 = (char *)Curl_memdup0(ptr,length);
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)((data->set).str[0x4a]);
        (data->set).str[0x4a] = pcVar6;
        goto LAB_00154b63;
      }
      CVar5 = Curl_setstropt((data->set).str + 0x4a,ptr);
      pcVar6 = (data->set).str[0x4a];
    }
    (data->set).postfields = pcVar6;
LAB_00154c3c:
    (data->set).method = '\x01';
    goto switchD_00153fb5_caseD_275c;
  case 0x27b6:
  case CURLOPT_OPENSOCKETDATA|CURLOPT_PORT:
  case 0x27bb:
  case 0x27bc:
  case 0x27c2:
  case 0x27c4:
  case 0x27c5:
  case 0x27c6:
  case CURLOPT_SSH_KNOWNHOSTS:
  case 0x27c8:
  case CURLOPT_SSH_KEYDATA:
  case CURLOPT_MAIL_RCPT:
  case 0x27cc:
  case CURLOPT_PROXYPASSWORD|CURLOPT_TIMEOUT:
  case 0x27d1:
  case 0x27d2:
  case 0x27d4:
  case 0x27d5:
  case 0x27d6:
  case 0x27d7:
  case 0x27d8:
  case CURLOPT_RESOLVE:
  case 0x27df:
  case CURLOPT_PROXYPASSWORD|CURLOPT_SSLVERSION:
  case CURLOPT_PROXYPASSWORD|CURLOPT_TIMEVALUE:
  case CURLOPT_DNS_SERVERS:
  case 0x27e4:
  case 0x27e5:
  case 0x27e6:
  case 0x27e7:
  case 0x27e8:
  case CURLOPT_PROXYPASSWORD|CURLOPT_HEADER:
  case CURLOPT_PROXYPASSWORD|CURLOPT_NOPROGRESS:
  case CURLOPT_DNS_INTERFACE:
  case CURLOPT_DNS_LOCAL_IP4:
  case CURLOPT_DNS_LOCAL_IP6:
  case 0x27f1:
  case 0x27f2:
  case CURLOPT_LOGIN_OPTIONS|CURLOPT_PORT:
  case CURLOPT_PROXYHEADER:
  case 0x27f5:
  case 0x27f8:
  case 0x27f9:
  case 0x27fa:
  case 0x27fd:
  case 0x27ff:
  case CURLOPT_STREAM_DEPENDS:
  case CURLOPT_STREAM_DEPENDS_E:
  case 0x2802:
  case CURLOPT_CONNECT_TO:
  case 0x2804:
  case 0x2805:
  case 0x2808:
  case 0x2809:
  case 0x280a:
  case 0x2815:
  case 0x2819:
  case 0x281b:
  case 0x281c:
  case CURLOPT_MIMEPOST:
  case 0x281e:
  case 0x281f:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_SSLVERSION:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_TIMEVALUE:
  case 0x2823:
  case 0x2826:
  case 0x2828:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_VERBOSE:
  case 0x282b:
  case 0x282d:
  case 0x282e:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_DIRLISTONLY:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_APPEND:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_NETRC:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_FOLLOWLOCATION:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_TRANSFERTEXT:
  case CURLOPT_STREAM_DEPENDS|CURLOPT_PUT:
  case 0x2837:
  case 0x2839:
  case 0x283b:
  case 0x283d:
  case 0x283f:
  case 0x2842:
  case CURLOPT_HSTSWRITEDATA|CURLOPT_PORT:
  case 0x2844:
  case 0x2845:
  case 0x2846:
  case CURLOPT_SSH_HOST_PUBLIC_KEY_SHA256:
  case 0x2848:
  case 0x284a:
  case 0x284b:
  case 0x284c:
  case CURLOPT_SSH_HOSTKEYDATA:
  case 0x2850:
  case 0x2851:
  case 0x2852:
    goto switchD_00153f5d_caseD_27b6;
  case CURLOPT_SEEKDATA:
    (data->set).seek_client = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_CRLFILE:
    charp = (data->set).str + 10;
    break;
  case CURLOPT_ISSUERCERT:
    charp = (data->set).str + 0xb;
    break;
  case CURLOPT_USERNAME:
    charp = (data->set).str + 0x2d;
    break;
  case CURLOPT_PASSWORD:
    charp = (data->set).str + 0x2e;
    break;
  case CURLOPT_PROXYUSERNAME:
    charp = (data->set).str + 0x30;
    break;
  case CURLOPT_PROXYPASSWORD:
    charp = (data->set).str + 0x31;
    break;
  case CURLOPT_NOPROXY:
    charp = (data->set).str + 0x32;
    break;
  case CURLOPT_SOCKS5_GSSAPI_SERVICE:
  case CURLOPT_PROXY_SERVICE_NAME:
    charp = (data->set).str + 0x19;
    break;
  case CURLOPT_MAIL_FROM:
    charp = (data->set).str + 0x36;
    break;
  case CURLOPT_RTSP_SESSION_ID:
    charp = (data->set).str + 0x33;
    break;
  case CURLOPT_RTSP_STREAM_URI:
    charp = (data->set).str + 0x34;
    break;
  case CURLOPT_RTSP_TRANSPORT:
    charp = (data->set).str + 0x35;
    break;
  case CURLOPT_INTERLEAVEDATA:
    (data->set).rtp_out = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_CHUNK_DATA:
    (data->set).wildcardptr = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_FNMATCH_DATA:
    (data->set).fnmatch_data = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_TLSAUTH_USERNAME:
    charp = (data->set).str + 0x38;
    break;
  case CURLOPT_TLSAUTH_PASSWORD:
    charp = (data->set).str + 0x39;
    break;
  case CURLOPT_TLSAUTH_TYPE:
  case CURLOPT_PROXY_TLSAUTH_TYPE:
    if ((ptr != (char *)0x0) && (iVar3 = curl_strequal(ptr,"SRP"), iVar3 == 0)) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_CLOSESOCKETDATA:
    (data->set).closesocket_client = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_MAIL_AUTH:
    charp = (data->set).str + 0x37;
    break;
  case CURLOPT_XOAUTH2_BEARER:
    charp = (data->set).str + 0x3c;
    break;
  case CURLOPT_LOGIN_OPTIONS:
    charp = (data->set).str + 0x2f;
    break;
  case CURLOPT_PINNEDPUBLICKEY:
    _Var2 = Curl_ssl_supports(data,4);
    if (!_Var2) {
      return CURLE_NOT_BUILT_IN;
    }
    charp = (data->set).str + 7;
    break;
  case CURLOPT_UNIX_SOCKET_PATH:
    puVar1 = &(data->set).field_0x8a2;
    *puVar1 = *puVar1 & 0xfe;
    goto LAB_001549ce;
  case CURLOPT_SERVICE_NAME:
    charp = (data->set).str + 0xc;
    break;
  case CURLOPT_DEFAULT_PROTOCOL:
    charp = (data->set).str + 0x1d;
    break;
  case CURLOPT_PROXY_CAINFO:
    charp = (data->set).str + 0x13;
    break;
  case CURLOPT_PROXY_CAPATH:
    _Var2 = Curl_ssl_supports(data,1);
    if (!_Var2) {
      return CURLE_NOT_BUILT_IN;
    }
    charp = (data->set).str + 0x12;
    break;
  case CURLOPT_PROXY_TLSAUTH_USERNAME:
    charp = (data->set).str + 0x3a;
    break;
  case CURLOPT_PROXY_TLSAUTH_PASSWORD:
    charp = (data->set).str + 0x3b;
    break;
  case CURLOPT_PROXY_SSLCERT:
    charp = (data->set).str + 0xd;
    break;
  case CURLOPT_PROXY_SSLCERTTYPE:
    charp = (data->set).str + 0xe;
    break;
  case CURLOPT_PROXY_SSLKEY:
    charp = (data->set).str + 0xf;
    break;
  case CURLOPT_PROXY_SSLKEYTYPE:
    charp = (data->set).str + 0x11;
    break;
  case CURLOPT_PROXY_KEYPASSWD:
    charp = (data->set).str + 0x10;
    break;
  case CURLOPT_PROXY_SSL_CIPHER_LIST:
    _Var2 = Curl_ssl_supports(data,0x200);
    if (!_Var2) {
      return CURLE_NOT_BUILT_IN;
    }
    charp = (data->set).str + 0x15;
    break;
  case CURLOPT_PROXY_CRLFILE:
    charp = (data->set).str + 0x17;
    break;
  case CURLOPT_PRE_PROXY:
    charp = (data->set).str + 0x27;
    break;
  case CURLOPT_PROXY_PINNEDPUBLICKEY:
    _Var2 = Curl_ssl_supports(data,4);
    if (!_Var2) {
      return CURLE_NOT_BUILT_IN;
    }
    charp = (data->set).str + 0x14;
    break;
  case CURLOPT_ABSTRACT_UNIX_SOCKET:
    puVar1 = &(data->set).field_0x8a2;
    *puVar1 = *puVar1 | 1;
LAB_001549ce:
    charp = (data->set).str + 0x3d;
    break;
  case CURLOPT_REQUEST_TARGET:
    charp = (data->set).str + 0x3e;
    break;
  case CURLOPT_RESOLVER_START_DATA:
    (data->set).resolver_start_client = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_TLS13_CIPHERS:
    _Var2 = Curl_ssl_supports(data,0x20);
    if (!_Var2) {
      return CURLE_NOT_BUILT_IN;
    }
    charp = (data->set).str + 9;
    break;
  case CURLOPT_PROXY_TLS13_CIPHERS:
    _Var2 = Curl_ssl_supports(data,0x20);
    if (!_Var2) {
      return CURLE_NOT_BUILT_IN;
    }
    charp = (data->set).str + 0x16;
    break;
  case CURLOPT_DOH_URL:
    CVar5 = Curl_setstropt((data->set).str + 0x3f,ptr);
    uVar13 = (ulong)((data->set).str[0x3f] != (char *)0x0) << 0x32;
    uVar10 = 0xfffbffffffffffff;
LAB_00154981:
    *(ulong *)&(data->set).field_0x89c = uVar10 & *(ulong *)&(data->set).field_0x89c | uVar13;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_CURLU:
    if (((data->state).field_0x7c0 & 1) == 0) {
      (data->state).url = (char *)0x0;
    }
    else {
      (*Curl_cfree)((data->state).url);
      (data->state).url = (char *)0x0;
      puVar1 = &(data->state).field_0x7c0;
      *puVar1 = *puVar1 & 0xfe;
    }
    (*Curl_cfree)((data->set).str[0x2a]);
    (data->set).str[0x2a] = (char *)0x0;
    (data->set).uh = (CURLU *)ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_TRAILERDATA:
    (data->set).trailer_data = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_ALTSVC:
    if (data->asi == (altsvcinfo *)0x0) {
      paVar9 = Curl_altsvc_init();
      data->asi = paVar9;
      if (paVar9 == (altsvcinfo *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar4 = Curl_setstropt((data->set).str + 0x40,ptr);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (ptr != (char *)0x0) {
      Curl_altsvc_load(data->asi,ptr);
    }
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_SASL_AUTHZID:
    charp = (data->set).str + 0x42;
    break;
  case CURLOPT_PROXY_ISSUERCERT:
    charp = (data->set).str + 0x18;
    break;
  case CURLOPT_SSL_EC_CURVES:
    charp = (data->set).str + 0x43;
    break;
  case CURLOPT_HSTS:
    if (data->hsts == (hsts *)0x0) {
      phVar7 = Curl_hsts_init();
      data->hsts = phVar7;
      if (phVar7 == (hsts *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if (ptr == (char *)0x0) {
      curl_slist_free_all((data->state).hstslist);
      (data->state).hstslist = (curl_slist *)0x0;
      if ((data->share == (Curl_share *)0x0) || (data->share->hsts == (hsts *)0x0)) {
        Curl_hsts_cleanup(&data->hsts);
      }
    }
    else {
      CVar4 = Curl_setstropt((data->set).str + 0x41,ptr);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      pcVar8 = curl_slist_append((data->state).hstslist,ptr);
      if (pcVar8 == (curl_slist *)0x0) {
        curl_slist_free_all((data->state).hstslist);
        (data->state).hstslist = (curl_slist *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      (data->state).hstslist = pcVar8;
    }
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_HSTSREADDATA:
    (data->set).hsts_read_userp = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_HSTSWRITEDATA:
    (data->set).hsts_write_userp = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_AWS_SIGV4:
    CVar5 = Curl_setstropt((data->set).str + 0x44,ptr);
    if ((data->set).str[0x44] != (char *)0x0) {
      (data->set).httpauth = 0x80;
    }
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_PREREQDATA:
    (data->set).prereq_userp = ptr;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_PROTOCOLS_STR:
    val = &(data->set).allowed_protocols;
    if (ptr != (char *)0x0) {
LAB_001549e7:
      CVar5 = protocol2num(ptr,val);
      return CVar5;
    }
    *val = 0xffffffff;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_REDIR_PROTOCOLS_STR:
    val = &(data->set).redir_protocols;
    if (ptr != (char *)0x0) goto LAB_001549e7;
    *val = 0xf;
    goto switchD_00153fb5_caseD_275c;
  case CURLOPT_HAPROXY_CLIENT_IP:
    CVar5 = Curl_setstropt((data->set).str + 0x45,ptr);
    puVar1 = &(data->set).field_0x8a1;
    *puVar1 = *puVar1 | 0x80;
    goto switchD_00153fb5_caseD_275c;
  default:
    if (option != CURLOPT_SOCKOPTDATA) {
      if (option != CURLOPT_SSL_SIGNATURE_ALGORITHMS) {
        return CURLE_UNKNOWN_OPTION;
      }
      _Var2 = Curl_ssl_supports(data,0x400);
      if (!_Var2) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 0x48;
      break;
    }
    (data->set).sockopt_client = ptr;
    CVar5 = CURLE_OK;
switchD_00153fb5_caseD_275c:
    CVar4 = CVar5;
switchD_00153f5d_caseD_27b6:
    return CVar4;
  }
LAB_00154a4a:
  CVar5 = Curl_setstropt(charp,ptr);
  return CVar5;
}

Assistant:

static CURLcode setopt_cptr(struct Curl_easy *data, CURLoption option,
                            char *ptr)
{
  CURLcode result = CURLE_OK;
  switch(option) {
  case CURLOPT_SSL_CIPHER_LIST:
    if(Curl_ssl_supports(data, SSLSUPP_CIPHER_LIST))
      /* set a list of cipher we want to use in the SSL connection */
      return Curl_setstropt(&data->set.str[STRING_SSL_CIPHER_LIST], ptr);
    else
      return CURLE_NOT_BUILT_IN;
#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_SSL_CIPHER_LIST:
    if(Curl_ssl_supports(data, SSLSUPP_CIPHER_LIST)) {
      /* set a list of cipher we want to use in the SSL connection for proxy */
      return Curl_setstropt(&data->set.str[STRING_SSL_CIPHER_LIST_PROXY],
                            ptr);
    }
    else
      return CURLE_NOT_BUILT_IN;
#endif
  case CURLOPT_TLS13_CIPHERS:
    if(Curl_ssl_supports(data, SSLSUPP_TLS13_CIPHERSUITES)) {
      /* set preferred list of TLS 1.3 cipher suites */
      return Curl_setstropt(&data->set.str[STRING_SSL_CIPHER13_LIST], ptr);
    }
    else
      return CURLE_NOT_BUILT_IN;
#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_TLS13_CIPHERS:
    if(Curl_ssl_supports(data, SSLSUPP_TLS13_CIPHERSUITES))
      /* set preferred list of TLS 1.3 cipher suites for proxy */
      return Curl_setstropt(&data->set.str[STRING_SSL_CIPHER13_LIST_PROXY],
                            ptr);
    else
      return CURLE_NOT_BUILT_IN;
#endif
  case CURLOPT_RANDOM_FILE:
    break;
  case CURLOPT_EGDSOCKET:
    break;
  case CURLOPT_REQUEST_TARGET:
    return Curl_setstropt(&data->set.str[STRING_TARGET], ptr);
#ifndef CURL_DISABLE_NETRC
  case CURLOPT_NETRC_FILE:
    /*
     * Use this file instead of the $HOME/.netrc file
     */
    return Curl_setstropt(&data->set.str[STRING_NETRC_FILE], ptr);
#endif

#if !defined(CURL_DISABLE_HTTP) || !defined(CURL_DISABLE_MQTT)
  case CURLOPT_COPYPOSTFIELDS:
    /*
     * A string with POST data. Makes curl HTTP POST. Even if it is NULL.
     * If needed, CURLOPT_POSTFIELDSIZE must have been set prior to
     *  CURLOPT_COPYPOSTFIELDS and not altered later.
     */
    if(!ptr || data->set.postfieldsize == -1)
      result = Curl_setstropt(&data->set.str[STRING_COPYPOSTFIELDS], ptr);
    else {
      if(data->set.postfieldsize < 0)
        return CURLE_BAD_FUNCTION_ARGUMENT;
#if SIZEOF_CURL_OFF_T > SIZEOF_SIZE_T
      /*
       *  Check that requested length does not overflow the size_t type.
       */
      else if(data->set.postfieldsize > SIZE_T_MAX)
        return CURLE_OUT_OF_MEMORY;
#endif
      else {
        /* Allocate even when size == 0. This satisfies the need of possible
           later address compare to detect the COPYPOSTFIELDS mode, and to
           mark that postfields is used rather than read function or form
           data.
        */
        char *p = Curl_memdup0(ptr, (size_t)data->set.postfieldsize);
        if(!p)
          return CURLE_OUT_OF_MEMORY;
        else {
          free(data->set.str[STRING_COPYPOSTFIELDS]);
          data->set.str[STRING_COPYPOSTFIELDS] = p;
        }
      }
    }

    data->set.postfields = data->set.str[STRING_COPYPOSTFIELDS];
    data->set.method = HTTPREQ_POST;
    break;

  case CURLOPT_POSTFIELDS:
    /*
     * Like above, but use static data instead of copying it.
     */
    data->set.postfields = ptr;
    /* Release old copied data. */
    Curl_safefree(data->set.str[STRING_COPYPOSTFIELDS]);
    data->set.method = HTTPREQ_POST;
    break;
#endif /* ! CURL_DISABLE_HTTP || ! CURL_DISABLE_MQTT */

#ifndef CURL_DISABLE_HTTP
  case CURLOPT_ACCEPT_ENCODING:
    /*
     * String to use at the value of Accept-Encoding header.
     *
     * If the encoding is set to "" we use an Accept-Encoding header that
     * encompasses all the encodings we support.
     * If the encoding is set to NULL we do not send an Accept-Encoding header
     * and ignore an received Content-Encoding header.
     *
     */
    if(ptr && !*ptr) {
      char all[256];
      Curl_all_content_encodings(all, sizeof(all));
      return Curl_setstropt(&data->set.str[STRING_ENCODING], all);
    }
    return Curl_setstropt(&data->set.str[STRING_ENCODING], ptr);

#if !defined(CURL_DISABLE_AWS)
  case CURLOPT_AWS_SIGV4:
    /*
     * String that is merged to some authentication
     * parameters are used by the algorithm.
     */
    result = Curl_setstropt(&data->set.str[STRING_AWS_SIGV4], ptr);
    /*
     * Basic been set by default it need to be unset here
     */
    if(data->set.str[STRING_AWS_SIGV4])
      data->set.httpauth = CURLAUTH_AWS_SIGV4;
    break;
#endif
  case CURLOPT_REFERER:
    /*
     * String to set in the HTTP Referer: field.
     */
    if(data->state.referer_alloc) {
      Curl_safefree(data->state.referer);
      data->state.referer_alloc = FALSE;
    }
    result = Curl_setstropt(&data->set.str[STRING_SET_REFERER], ptr);
    data->state.referer = data->set.str[STRING_SET_REFERER];
    break;

  case CURLOPT_USERAGENT:
    /*
     * String to use in the HTTP User-Agent field
     */
    return Curl_setstropt(&data->set.str[STRING_USERAGENT], ptr);

#if !defined(CURL_DISABLE_COOKIES)
  case CURLOPT_COOKIE:
    /*
     * Cookie string to send to the remote server in the request.
     */
    return Curl_setstropt(&data->set.str[STRING_COOKIE], ptr);

  case CURLOPT_COOKIEFILE:
    /*
     * Set cookie file to read and parse. Can be used multiple times.
     */
    if(ptr) {
      struct curl_slist *cl;
      /* general protection against mistakes and abuse */
      if(strlen(ptr) > CURL_MAX_INPUT_LENGTH)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      /* append the cookie filename to the list of filenames, and deal with
         them later */
      cl = curl_slist_append(data->state.cookielist, ptr);
      if(!cl) {
        curl_slist_free_all(data->state.cookielist);
        data->state.cookielist = NULL;
        return CURLE_OUT_OF_MEMORY;
      }
      data->state.cookielist = cl; /* store the list for later use */
    }
    else {
      /* clear the list of cookie files */
      curl_slist_free_all(data->state.cookielist);
      data->state.cookielist = NULL;

      if(!data->share || !data->share->cookies) {
        /* throw away all existing cookies if this is not a shared cookie
           container */
        Curl_cookie_clearall(data->cookies);
        Curl_cookie_cleanup(data->cookies);
      }
      /* disable the cookie engine */
      data->cookies = NULL;
    }
    break;

  case CURLOPT_COOKIEJAR:
    /*
     * Set cookie filename to dump all cookies to when we are done.
     */
    result = Curl_setstropt(&data->set.str[STRING_COOKIEJAR], ptr);
    if(!result) {
      /*
       * Activate the cookie parser. This may or may not already
       * have been made.
       */
      struct CookieInfo *newcookies =
        Curl_cookie_init(data, NULL, data->cookies, data->set.cookiesession);
      if(!newcookies)
        result = CURLE_OUT_OF_MEMORY;
      data->cookies = newcookies;
    }
    break;

  case CURLOPT_COOKIELIST:
    if(!ptr)
      break;

    if(strcasecompare(ptr, "ALL")) {
      /* clear all cookies */
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_clearall(data->cookies);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    else if(strcasecompare(ptr, "SESS")) {
      /* clear session cookies */
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_clearsess(data->cookies);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    else if(strcasecompare(ptr, "FLUSH")) {
      /* flush cookies to file, takes care of the locking */
      Curl_flush_cookies(data, FALSE);
    }
    else if(strcasecompare(ptr, "RELOAD")) {
      /* reload cookies from file */
      Curl_cookie_loadfiles(data);
      break;
    }
    else {
      if(!data->cookies) {
        /* if cookie engine was not running, activate it */
        data->cookies = Curl_cookie_init(data, NULL, NULL, TRUE);
        if(!data->cookies)
          return CURLE_OUT_OF_MEMORY;
      }

      /* general protection against mistakes and abuse */
      if(strlen(ptr) > CURL_MAX_INPUT_LENGTH)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      if(checkprefix("Set-Cookie:", ptr))
        /* HTTP Header format line */
        Curl_cookie_add(data, data->cookies, TRUE, FALSE, ptr + 11, NULL,
                        NULL, TRUE);
      else
        /* Netscape format line */
        Curl_cookie_add(data, data->cookies, FALSE, FALSE, ptr, NULL,
                        NULL, TRUE);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    break;
#endif /* !CURL_DISABLE_COOKIES */

#endif /* ! CURL_DISABLE_HTTP */

  case CURLOPT_CUSTOMREQUEST:
    /*
     * Set a custom string to use as request
     */
    return Curl_setstropt(&data->set.str[STRING_CUSTOMREQUEST], ptr);

    /* we do not set
       data->set.method = HTTPREQ_CUSTOM;
       here, we continue as if we were using the already set type
       and this just changes the actual request keyword */

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY:
    /*
     * Set proxy server:port to use as proxy.
     *
     * If the proxy is set to "" (and CURLOPT_SOCKS_PROXY is set to "" or NULL)
     * we explicitly say that we do not want to use a proxy
     * (even though there might be environment variables saying so).
     *
     * Setting it to NULL, means no proxy but allows the environment variables
     * to decide for us (if CURLOPT_SOCKS_PROXY setting it to NULL).
     */
    return Curl_setstropt(&data->set.str[STRING_PROXY], ptr);

  case CURLOPT_PRE_PROXY:
    /*
     * Set proxy server:port to use as SOCKS proxy.
     *
     * If the proxy is set to "" or NULL we explicitly say that we do not want
     * to use the socks proxy.
     */
    return Curl_setstropt(&data->set.str[STRING_PRE_PROXY], ptr);
#endif   /* CURL_DISABLE_PROXY */

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_SOCKS5_GSSAPI_SERVICE:
  case CURLOPT_PROXY_SERVICE_NAME:
    /*
     * Set proxy authentication service name for Kerberos 5 and SPNEGO
     */
    return Curl_setstropt(&data->set.str[STRING_PROXY_SERVICE_NAME], ptr);
#endif
  case CURLOPT_SERVICE_NAME:
    /*
     * Set authentication service name for DIGEST-MD5, Kerberos 5 and SPNEGO
     */
    return Curl_setstropt(&data->set.str[STRING_SERVICE_NAME], ptr);

  case CURLOPT_HEADERDATA:
    /*
     * Custom pointer to pass the header write callback function
     */
    data->set.writeheader = ptr;
    break;
  case CURLOPT_READDATA:
    /*
     * FILE pointer to read the file to be uploaded from. Or possibly used as
     * argument to the read callback.
     */
    data->set.in_set = ptr;
    break;
  case CURLOPT_WRITEDATA:
    /*
     * FILE pointer to write to. Or possibly used as argument to the write
     * callback.
     */
    data->set.out = ptr;
    break;
  case CURLOPT_DEBUGDATA:
    /*
     * Set to a void * that should receive all error writes. This
     * defaults to CURLOPT_STDERR for normal operations.
     */
    data->set.debugdata = ptr;
    break;
  case CURLOPT_PROGRESSDATA:
    /*
     * Custom client data to pass to the progress callback
     */
    data->set.progress_client = ptr;
    break;
  case CURLOPT_SEEKDATA:
    /*
     * Seek control callback. Might be NULL.
     */
    data->set.seek_client = ptr;
    break;
  case CURLOPT_IOCTLDATA:
    /*
     * I/O control data pointer. Might be NULL.
     */
    data->set.ioctl_client = ptr;
    break;
  case CURLOPT_SSL_CTX_DATA:
    /*
     * Set a SSL_CTX callback parameter pointer
     */
#ifdef USE_SSL
    if(Curl_ssl_supports(data, SSLSUPP_SSL_CTX)) {
      data->set.ssl.fsslctxp = ptr;
      break;
    }
    else
#endif
      return CURLE_NOT_BUILT_IN;
  case CURLOPT_SOCKOPTDATA:
    /*
     * socket callback data pointer. Might be NULL.
     */
    data->set.sockopt_client = ptr;
    break;
  case CURLOPT_OPENSOCKETDATA:
    /*
     * socket callback data pointer. Might be NULL.
     */
    data->set.opensocket_client = ptr;
    break;
  case CURLOPT_RESOLVER_START_DATA:
    /*
     * resolver start callback data pointer. Might be NULL.
     */
    data->set.resolver_start_client = ptr;
    break;
  case CURLOPT_CLOSESOCKETDATA:
    /*
     * socket callback data pointer. Might be NULL.
     */
    data->set.closesocket_client = ptr;
    break;
  case CURLOPT_TRAILERDATA:
#ifndef CURL_DISABLE_HTTP
    data->set.trailer_data = ptr;
#endif
    break;
  case CURLOPT_PREREQDATA:
    data->set.prereq_userp = ptr;
    break;

  case CURLOPT_ERRORBUFFER:
    /*
     * Error buffer provided by the caller to get the human readable error
     * string in.
     */
    data->set.errorbuffer = ptr;
    break;

#ifndef CURL_DISABLE_FTP
  case CURLOPT_FTPPORT:
    /*
     * Use FTP PORT, this also specifies which IP address to use
     */
    result = Curl_setstropt(&data->set.str[STRING_FTPPORT], ptr);
    data->set.ftp_use_port = !!(data->set.str[STRING_FTPPORT]);
    break;

  case CURLOPT_FTP_ACCOUNT:
    return Curl_setstropt(&data->set.str[STRING_FTP_ACCOUNT], ptr);

  case CURLOPT_FTP_ALTERNATIVE_TO_USER:
    return Curl_setstropt(&data->set.str[STRING_FTP_ALTERNATIVE_TO_USER], ptr);

#ifdef HAVE_GSSAPI
  case CURLOPT_KRBLEVEL:
    /*
     * A string that defines the kerberos security level.
     */
    result = Curl_setstropt(&data->set.str[STRING_KRB_LEVEL], ptr);
    data->set.krb = !!(data->set.str[STRING_KRB_LEVEL]);
    break;
#endif
#endif
  case CURLOPT_URL:
    /*
     * The URL to fetch.
     */
    if(data->state.url_alloc) {
      Curl_safefree(data->state.url);
      data->state.url_alloc = FALSE;
    }
    result = Curl_setstropt(&data->set.str[STRING_SET_URL], ptr);
    data->state.url = data->set.str[STRING_SET_URL];
    break;

  case CURLOPT_USERPWD:
    /*
     * user:password to use in the operation
     */
    return setstropt_userpwd(ptr, &data->set.str[STRING_USERNAME],
                             &data->set.str[STRING_PASSWORD]);

  case CURLOPT_USERNAME:
    /*
     * authentication username to use in the operation
     */
    return Curl_setstropt(&data->set.str[STRING_USERNAME], ptr);

  case CURLOPT_PASSWORD:
    /*
     * authentication password to use in the operation
     */
    return Curl_setstropt(&data->set.str[STRING_PASSWORD], ptr);

  case CURLOPT_LOGIN_OPTIONS:
    /*
     * authentication options to use in the operation
     */
    return Curl_setstropt(&data->set.str[STRING_OPTIONS], ptr);

  case CURLOPT_XOAUTH2_BEARER:
    /*
     * OAuth 2.0 bearer token to use in the operation
     */
    return Curl_setstropt(&data->set.str[STRING_BEARER], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXYUSERPWD: {
    /*
     * user:password needed to use the proxy
     */
    char *u = NULL;
    char *p = NULL;
    result = setstropt_userpwd(ptr, &u, &p);

    /* URL decode the components */
    if(!result && u) {
      Curl_safefree(data->set.str[STRING_PROXYUSERNAME]);
      result = Curl_urldecode(u, 0, &data->set.str[STRING_PROXYUSERNAME], NULL,
                              REJECT_ZERO);
    }
    if(!result && p) {
      Curl_safefree(data->set.str[STRING_PROXYPASSWORD]);
      result = Curl_urldecode(p, 0, &data->set.str[STRING_PROXYPASSWORD], NULL,
                              REJECT_ZERO);
    }
    free(u);
    free(p);
  }
    break;
  case CURLOPT_PROXYUSERNAME:
    /*
     * authentication username to use in the operation
     */
    return Curl_setstropt(&data->set.str[STRING_PROXYUSERNAME], ptr);

  case CURLOPT_PROXYPASSWORD:
    /*
     * authentication password to use in the operation
     */
    return Curl_setstropt(&data->set.str[STRING_PROXYPASSWORD], ptr);

  case CURLOPT_NOPROXY:
    /*
     * proxy exception list
     */
    return Curl_setstropt(&data->set.str[STRING_NOPROXY], ptr);
#endif /* ! CURL_DISABLE_PROXY */

  case CURLOPT_RANGE:
    /*
     * What range of the file you want to transfer
     */
    return Curl_setstropt(&data->set.str[STRING_SET_RANGE], ptr);

  case CURLOPT_CURLU:
    /*
     * pass CURLU to set URL
     */
    if(data->state.url_alloc) {
      Curl_safefree(data->state.url);
      data->state.url_alloc = FALSE;
    }
    else
      data->state.url = NULL;
    Curl_safefree(data->set.str[STRING_SET_URL]);
    data->set.uh = (CURLU *)ptr;
    break;
  case CURLOPT_SSLCERT:
    /*
     * String that holds filename of the SSL certificate to use
     */
    return Curl_setstropt(&data->set.str[STRING_CERT], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_SSLCERT:
    /*
     * String that holds filename of the SSL certificate to use for proxy
     */
    return Curl_setstropt(&data->set.str[STRING_CERT_PROXY], ptr);

#endif
  case CURLOPT_SSLCERTTYPE:
    /*
     * String that holds file type of the SSL certificate to use
     */
    return Curl_setstropt(&data->set.str[STRING_CERT_TYPE], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_SSLCERTTYPE:
    /*
     * String that holds file type of the SSL certificate to use for proxy
     */
    return Curl_setstropt(&data->set.str[STRING_CERT_TYPE_PROXY], ptr);

#endif
  case CURLOPT_SSLKEY:
    /*
     * String that holds filename of the SSL key to use
     */
    return Curl_setstropt(&data->set.str[STRING_KEY], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_SSLKEY:
    /*
     * String that holds filename of the SSL key to use for proxy
     */
    return Curl_setstropt(&data->set.str[STRING_KEY_PROXY], ptr);

#endif
  case CURLOPT_SSLKEYTYPE:
    /*
     * String that holds file type of the SSL key to use
     */
    return Curl_setstropt(&data->set.str[STRING_KEY_TYPE], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_SSLKEYTYPE:
    /*
     * String that holds file type of the SSL key to use for proxy
     */
    return Curl_setstropt(&data->set.str[STRING_KEY_TYPE_PROXY], ptr);

#endif
  case CURLOPT_KEYPASSWD:
    /*
     * String that holds the SSL or SSH private key password.
     */
    return Curl_setstropt(&data->set.str[STRING_KEY_PASSWD], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_KEYPASSWD:
    /*
     * String that holds the SSL private key password for proxy.
     */
    return Curl_setstropt(&data->set.str[STRING_KEY_PASSWD_PROXY], ptr);

#endif
  case CURLOPT_SSLENGINE:
    /*
     * String that holds the SSL crypto engine.
     */
    if(ptr && ptr[0]) {
      result = Curl_setstropt(&data->set.str[STRING_SSL_ENGINE], ptr);
      if(!result) {
        result = Curl_ssl_set_engine(data, ptr);
      }
    }
    break;

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_HAPROXY_CLIENT_IP:
    /*
     * Set the client IP to send through HAProxy PROXY protocol
     */
    result = Curl_setstropt(&data->set.str[STRING_HAPROXY_CLIENT_IP], ptr);
    /* enable the HAProxy protocol */
    data->set.haproxyprotocol = TRUE;
    break;

#endif
  case CURLOPT_INTERFACE:
    /*
     * Set what interface or address/hostname to bind the socket to when
     * performing an operation and thus what from-IP your connection will use.
     */
    return setstropt_interface(ptr,
                               &data->set.str[STRING_DEVICE],
                               &data->set.str[STRING_INTERFACE],
                               &data->set.str[STRING_BINDHOST]);

  case CURLOPT_PINNEDPUBLICKEY:
    /*
     * Set pinned public key for SSL connection.
     * Specify filename of the public key in DER format.
     */
#ifdef USE_SSL
    if(Curl_ssl_supports(data, SSLSUPP_PINNEDPUBKEY))
      return Curl_setstropt(&data->set.str[STRING_SSL_PINNEDPUBLICKEY], ptr);
#endif
    return CURLE_NOT_BUILT_IN;

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_PINNEDPUBLICKEY:
    /*
     * Set pinned public key for SSL connection.
     * Specify filename of the public key in DER format.
     */
#ifdef USE_SSL
    if(Curl_ssl_supports(data, SSLSUPP_PINNEDPUBKEY))
      return Curl_setstropt(&data->set.str[STRING_SSL_PINNEDPUBLICKEY_PROXY],
                            ptr);
#endif
    return CURLE_NOT_BUILT_IN;
#endif
  case CURLOPT_CAINFO:
    /*
     * Set CA info for SSL connection. Specify filename of the CA certificate
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_CAFILE], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_CAINFO:
    /*
     * Set CA info SSL connection for proxy. Specify filename of the
     * CA certificate
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_CAFILE_PROXY], ptr);

#endif
  case CURLOPT_CAPATH:
    /*
     * Set CA path info for SSL connection. Specify directory name of the CA
     * certificates which have been prepared using openssl c_rehash utility.
     */
#ifdef USE_SSL
    if(Curl_ssl_supports(data, SSLSUPP_CA_PATH))
      /* This does not work on Windows. */
      return Curl_setstropt(&data->set.str[STRING_SSL_CAPATH], ptr);
#endif
    return CURLE_NOT_BUILT_IN;
#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_CAPATH:
    /*
     * Set CA path info for SSL connection proxy. Specify directory name of the
     * CA certificates which have been prepared using openssl c_rehash utility.
     */
#ifdef USE_SSL
    if(Curl_ssl_supports(data, SSLSUPP_CA_PATH))
      /* This does not work on Windows. */
      return Curl_setstropt(&data->set.str[STRING_SSL_CAPATH_PROXY], ptr);
#endif
    return CURLE_NOT_BUILT_IN;
#endif
  case CURLOPT_CRLFILE:
    /*
     * Set CRL file info for SSL connection. Specify filename of the CRL
     * to check certificates revocation
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_CRLFILE], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_CRLFILE:
    /*
     * Set CRL file info for SSL connection for proxy. Specify filename of the
     * CRL to check certificates revocation
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_CRLFILE_PROXY], ptr);

#endif
  case CURLOPT_ISSUERCERT:
    /*
     * Set Issuer certificate file
     * to check certificates issuer
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_ISSUERCERT], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_ISSUERCERT:
    /*
     * Set Issuer certificate file
     * to check certificates issuer
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_ISSUERCERT_PROXY], ptr);

#endif
  case CURLOPT_PRIVATE:
    /*
     * Set private data pointer.
     */
    data->set.private_data = ptr;
    break;

#ifdef USE_SSL
  case CURLOPT_SSL_EC_CURVES:
    /*
     * Set accepted curves in SSL connection setup.
     * Specify colon-delimited list of curve algorithm names.
     */
    return Curl_setstropt(&data->set.str[STRING_SSL_EC_CURVES], ptr);

  case CURLOPT_SSL_SIGNATURE_ALGORITHMS:
    /*
     * Set accepted signature algorithms.
     * Specify colon-delimited list of signature scheme names.
     */
    if(Curl_ssl_supports(data, SSLSUPP_SIGNATURE_ALGORITHMS))
      return Curl_setstropt(&data->set.str[STRING_SSL_SIGNATURE_ALGORITHMS],
                            ptr);
    return CURLE_NOT_BUILT_IN;
#endif
#ifdef USE_SSH
  case CURLOPT_SSH_PUBLIC_KEYFILE:
    /*
     * Use this file instead of the $HOME/.ssh/id_dsa.pub file
     */
    return Curl_setstropt(&data->set.str[STRING_SSH_PUBLIC_KEY], ptr);

  case CURLOPT_SSH_PRIVATE_KEYFILE:
    /*
     * Use this file instead of the $HOME/.ssh/id_dsa file
     */
    return Curl_setstropt(&data->set.str[STRING_SSH_PRIVATE_KEY], ptr);

#if defined(USE_LIBSSH2) || defined(USE_LIBSSH)
  case CURLOPT_SSH_HOST_PUBLIC_KEY_MD5:
    /*
     * Option to allow for the MD5 of the host public key to be checked
     * for validation purposes.
     */
    return Curl_setstropt(&data->set.str[STRING_SSH_HOST_PUBLIC_KEY_MD5], ptr);

  case CURLOPT_SSH_KNOWNHOSTS:
    /*
     * Store the filename to read known hosts from.
     */
    return Curl_setstropt(&data->set.str[STRING_SSH_KNOWNHOSTS], ptr);
#endif
  case CURLOPT_SSH_KEYDATA:
    /*
     * Custom client data to pass to the SSH keyfunc callback
     */
    data->set.ssh_keyfunc_userp = ptr;
    break;
#ifdef USE_LIBSSH2
  case CURLOPT_SSH_HOST_PUBLIC_KEY_SHA256:
    /*
     * Option to allow for the SHA256 of the host public key to be checked
     * for validation purposes.
     */
    return Curl_setstropt(&data->set.str[STRING_SSH_HOST_PUBLIC_KEY_SHA256],
                          ptr);

  case CURLOPT_SSH_HOSTKEYDATA:
    /*
     * Custom client data to pass to the SSH keyfunc callback
     */
    data->set.ssh_hostkeyfunc_userp = ptr;
    break;
#endif /* USE_LIBSSH2 */
#endif /* USE_SSH */
  case CURLOPT_PROTOCOLS_STR:
    if(ptr)
      return protocol2num(ptr, &data->set.allowed_protocols);
    /* make a NULL argument reset to default */
    data->set.allowed_protocols = (curl_prot_t) CURLPROTO_ALL;
    break;

  case CURLOPT_REDIR_PROTOCOLS_STR:
    if(ptr)
      return protocol2num(ptr, &data->set.redir_protocols);
    /* make a NULL argument reset to default */
    data->set.redir_protocols = (curl_prot_t) CURLPROTO_REDIR;
    break;

  case CURLOPT_DEFAULT_PROTOCOL:
    /* Set the protocol to use when the URL does not include any protocol */
    return Curl_setstropt(&data->set.str[STRING_DEFAULT_PROTOCOL], ptr);

#ifndef CURL_DISABLE_SMTP
  case CURLOPT_MAIL_FROM:
    /* Set the SMTP mail originator */
    return Curl_setstropt(&data->set.str[STRING_MAIL_FROM], ptr);

  case CURLOPT_MAIL_AUTH:
    /* Set the SMTP auth originator */
    return Curl_setstropt(&data->set.str[STRING_MAIL_AUTH], ptr);
#endif
  case CURLOPT_SASL_AUTHZID:
    /* Authorization identity (identity to act as) */
    return Curl_setstropt(&data->set.str[STRING_SASL_AUTHZID], ptr);

#ifndef CURL_DISABLE_RTSP
  case CURLOPT_RTSP_SESSION_ID:
    /*
     * Set the RTSP Session ID manually. Useful if the application is
     * resuming a previously established RTSP session
     */
    return Curl_setstropt(&data->set.str[STRING_RTSP_SESSION_ID], ptr);

  case CURLOPT_RTSP_STREAM_URI:
    /*
     * Set the Stream URI for the RTSP request. Unless the request is
     * for generic server options, the application will need to set this.
     */
    return Curl_setstropt(&data->set.str[STRING_RTSP_STREAM_URI], ptr);

  case CURLOPT_RTSP_TRANSPORT:
    /*
     * The content of the Transport: header for the RTSP request
     */
    return Curl_setstropt(&data->set.str[STRING_RTSP_TRANSPORT], ptr);

  case CURLOPT_INTERLEAVEDATA:
    data->set.rtp_out = ptr;
    break;
#endif /* ! CURL_DISABLE_RTSP */
#ifndef CURL_DISABLE_FTP
  case CURLOPT_CHUNK_DATA:
    data->set.wildcardptr = ptr;
    break;
  case CURLOPT_FNMATCH_DATA:
    data->set.fnmatch_data = ptr;
    break;
#endif
#ifdef USE_TLS_SRP
  case CURLOPT_TLSAUTH_USERNAME:
    return Curl_setstropt(&data->set.str[STRING_TLSAUTH_USERNAME], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_TLSAUTH_USERNAME:
    return Curl_setstropt(&data->set.str[STRING_TLSAUTH_USERNAME_PROXY], ptr);

#endif
  case CURLOPT_TLSAUTH_PASSWORD:
    return Curl_setstropt(&data->set.str[STRING_TLSAUTH_PASSWORD], ptr);

#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_TLSAUTH_PASSWORD:
    return Curl_setstropt(&data->set.str[STRING_TLSAUTH_PASSWORD_PROXY], ptr);
#endif
  case CURLOPT_TLSAUTH_TYPE:
    if(ptr && !strcasecompare(ptr, "SRP"))
      return CURLE_BAD_FUNCTION_ARGUMENT;
    break;
#ifndef CURL_DISABLE_PROXY
  case CURLOPT_PROXY_TLSAUTH_TYPE:
    if(ptr && !strcasecompare(ptr, "SRP"))
      return CURLE_BAD_FUNCTION_ARGUMENT;
    break;
#endif
#endif
#ifdef CURLRES_ARES
  case CURLOPT_DNS_SERVERS:
    result = Curl_setstropt(&data->set.str[STRING_DNS_SERVERS], ptr);
    if(result)
      return result;
    return Curl_async_ares_set_dns_servers(data);

  case CURLOPT_DNS_INTERFACE:
    result = Curl_setstropt(&data->set.str[STRING_DNS_INTERFACE], ptr);
    if(result)
      return result;
    return Curl_async_ares_set_dns_interface(data);

  case CURLOPT_DNS_LOCAL_IP4:
    result = Curl_setstropt(&data->set.str[STRING_DNS_LOCAL_IP4], ptr);
    if(result)
      return result;
    return Curl_async_ares_set_dns_local_ip4(data);

  case CURLOPT_DNS_LOCAL_IP6:
    result = Curl_setstropt(&data->set.str[STRING_DNS_LOCAL_IP6], ptr);
    if(result)
      return result;
    return Curl_async_ares_set_dns_local_ip6(data);

#endif
#ifdef USE_UNIX_SOCKETS
  case CURLOPT_UNIX_SOCKET_PATH:
    data->set.abstract_unix_socket = FALSE;
    return Curl_setstropt(&data->set.str[STRING_UNIX_SOCKET_PATH], ptr);

  case CURLOPT_ABSTRACT_UNIX_SOCKET:
    data->set.abstract_unix_socket = TRUE;
    return Curl_setstropt(&data->set.str[STRING_UNIX_SOCKET_PATH], ptr);

#endif

#ifndef CURL_DISABLE_DOH
  case CURLOPT_DOH_URL:
    result = Curl_setstropt(&data->set.str[STRING_DOH], ptr);
    data->set.doh = !!(data->set.str[STRING_DOH]);
    break;
#endif
#ifndef CURL_DISABLE_HSTS
  case CURLOPT_HSTSREADDATA:
    data->set.hsts_read_userp = ptr;
    break;
  case CURLOPT_HSTSWRITEDATA:
    data->set.hsts_write_userp = ptr;
    break;
  case CURLOPT_HSTS: {
    struct curl_slist *h;
    if(!data->hsts) {
      data->hsts = Curl_hsts_init();
      if(!data->hsts)
        return CURLE_OUT_OF_MEMORY;
    }
    if(ptr) {
      result = Curl_setstropt(&data->set.str[STRING_HSTS], ptr);
      if(result)
        return result;
      /* this needs to build a list of filenames to read from, so that it can
         read them later, as we might get a shared HSTS handle to load them
         into */
      h = curl_slist_append(data->state.hstslist, ptr);
      if(!h) {
        curl_slist_free_all(data->state.hstslist);
        data->state.hstslist = NULL;
        return CURLE_OUT_OF_MEMORY;
      }
      data->state.hstslist = h; /* store the list for later use */
    }
    else {
      /* clear the list of HSTS files */
      curl_slist_free_all(data->state.hstslist);
      data->state.hstslist = NULL;
      if(!data->share || !data->share->hsts)
        /* throw away the HSTS cache unless shared */
        Curl_hsts_cleanup(&data->hsts);
    }
    break;
  }
#endif /* ! CURL_DISABLE_HSTS */
#ifndef CURL_DISABLE_ALTSVC
  case CURLOPT_ALTSVC:
    if(!data->asi) {
      data->asi = Curl_altsvc_init();
      if(!data->asi)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_setstropt(&data->set.str[STRING_ALTSVC], ptr);
    if(result)
      return result;
    if(ptr)
      (void)Curl_altsvc_load(data->asi, ptr);
    break;
#endif /* ! CURL_DISABLE_ALTSVC */
#ifdef USE_ECH
  case CURLOPT_ECH: {
    size_t plen = 0;

    if(!ptr) {
      data->set.tls_ech = CURLECH_DISABLE;
      return CURLE_OK;
    }
    plen = strlen(ptr);
    if(plen > CURL_MAX_INPUT_LENGTH) {
      data->set.tls_ech = CURLECH_DISABLE;
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    /* set tls_ech flag value, preserving CLA_CFG bit */
    if(!strcmp(ptr, "false"))
      data->set.tls_ech = CURLECH_DISABLE |
        (data->set.tls_ech & CURLECH_CLA_CFG);
    else if(!strcmp(ptr, "grease"))
      data->set.tls_ech = CURLECH_GREASE |
        (data->set.tls_ech & CURLECH_CLA_CFG);
    else if(!strcmp(ptr, "true"))
      data->set.tls_ech = CURLECH_ENABLE |
        (data->set.tls_ech & CURLECH_CLA_CFG);
    else if(!strcmp(ptr, "hard"))
      data->set.tls_ech = CURLECH_HARD |
        (data->set.tls_ech & CURLECH_CLA_CFG);
    else if(plen > 5 && !strncmp(ptr, "ecl:", 4)) {
      result = Curl_setstropt(&data->set.str[STRING_ECH_CONFIG], ptr + 4);
      if(result)
        return result;
      data->set.tls_ech |= CURLECH_CLA_CFG;
    }
    else if(plen > 4 && !strncmp(ptr, "pn:", 3)) {
      result = Curl_setstropt(&data->set.str[STRING_ECH_PUBLIC], ptr + 3);
      if(result)
        return result;
    }
    break;
  }
#endif
  default:
    return CURLE_UNKNOWN_OPTION;
  }
  return result;
}